

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_ps.c
# Opt level: O2

MPP_RET parse_one_rps(BitReadCtx_t *bitctx,Avs2dRps_t *rps)

{
  byte bVar1;
  MPP_RET MVar2;
  undefined8 in_RAX;
  ulong uVar3;
  ulong uVar4;
  undefined8 uStack_38;
  RK_S32 _out;
  
  uStack_38 = in_RAX;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","In","parse_one_rps");
  }
  MVar2 = mpp_read_bits(bitctx,1,&_out);
  bitctx->ret = MVar2;
  if (MVar2 == MPP_OK) {
    rps->refered_by_others = (byte)_out;
    MVar2 = mpp_read_bits(bitctx,3,&_out);
    bitctx->ret = MVar2;
    if (MVar2 == MPP_OK) {
      uVar4 = (ulong)(uint)_out;
      rps->num_of_ref = (RK_U8)((ulong)uStack_38 >> 0x20);
      if (((byte)avs2d_parse_debug & 8) != 0) {
        _mpp_log_l(4,"avs2d_ps","refered_by_others_flag %d, num_Of_ref %d","parse_one_rps",
                   (ulong)rps->refered_by_others,(ulong)(_out & 0xff));
        uVar4 = (ulong)rps->num_of_ref;
      }
      if (7 < (byte)uVar4) {
        _mpp_log_l(2,"avs2d_ps","invalid ref num(%d).\n","parse_one_rps",uVar4 & 0xff);
        if (((byte)avs2d_parse_debug & 8) == 0) {
          return MPP_NOK;
        }
        _mpp_log_l(4,"avs2d_ps","Out Failed\n","parse_one_rps");
        return MPP_NOK;
      }
      for (uVar3 = 0; uVar3 < (uVar4 & 0xff); uVar3 = uVar3 + 1) {
        MVar2 = mpp_read_bits(bitctx,6,&_out);
        bitctx->ret = MVar2;
        if (MVar2 != MPP_OK) goto LAB_0017f64a;
        rps->ref_pic[uVar3] = (RK_U8)((ulong)uStack_38 >> 0x20);
        if (((byte)avs2d_parse_debug & 8) != 0) {
          _mpp_log_l(4,"avs2d_ps","delta_doi_of_ref_pic[%d]=%d","parse_one_rps",uVar3 & 0xffffffff,
                     (ulong)(_out & 0xff));
        }
        uVar4 = (ulong)rps->num_of_ref;
      }
      MVar2 = mpp_read_bits(bitctx,3,&_out);
      bitctx->ret = MVar2;
      if (MVar2 == MPP_OK) {
        rps->num_to_remove = (byte)_out;
        bVar1 = (byte)_out;
        for (uVar4 = 0; uVar4 < bVar1; uVar4 = uVar4 + 1) {
          MVar2 = mpp_read_bits(bitctx,6,&_out);
          bitctx->ret = MVar2;
          if (MVar2 != MPP_OK) goto LAB_0017f64a;
          rps->remove_pic[uVar4] = (RK_U8)((ulong)uStack_38 >> 0x20);
          if (((byte)avs2d_parse_debug & 8) != 0) {
            _mpp_log_l(4,"avs2d_ps","num_of_removed_pic[%d]=%d","parse_one_rps",uVar4 & 0xffffffff,
                       (ulong)(_out & 0xff));
          }
          bVar1 = rps->num_to_remove;
        }
        MVar2 = mpp_read_bits(bitctx,1,&_out);
        bitctx->ret = MVar2;
        if ((MVar2 == MPP_OK) && ((byte)_out != '\x01')) {
          if (((byte)avs2d_parse_debug & 4) != 0) {
            _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,
                       0x10c);
          }
        }
        else if (MVar2 != MPP_OK) goto LAB_0017f64a;
        if (((byte)avs2d_parse_debug & 8) == 0) {
          return MPP_OK;
        }
        _mpp_log_l(4,"avs2d_ps","Out ret %d\n","parse_one_rps",0);
        return MPP_OK;
      }
    }
  }
LAB_0017f64a:
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","Out Bit read Err\n","parse_one_rps");
    MVar2 = bitctx->ret;
  }
  return MVar2;
}

Assistant:

static MPP_RET parse_one_rps(BitReadCtx_t *bitctx, Avs2dRps_t *rps)
{
    MPP_RET ret = MPP_OK;
    RK_U32 j;

    AVS2D_PARSE_TRACE("In");
    READ_ONEBIT(bitctx, &rps->refered_by_others);

    READ_BITS(bitctx, 3, &rps->num_of_ref);
    AVS2D_PARSE_TRACE("refered_by_others_flag %d, num_Of_ref %d", rps->refered_by_others, rps->num_of_ref);
    if (rps->num_of_ref > AVS2_MAX_REFS) {
        ret = MPP_NOK;
        mpp_err_f("invalid ref num(%d).\n", rps->num_of_ref);
        goto __FAILED;
    }
    for (j = 0; j < rps->num_of_ref; j++) {
        READ_BITS(bitctx, 6, &rps->ref_pic[j]);
        AVS2D_PARSE_TRACE("delta_doi_of_ref_pic[%d]=%d", j, rps->ref_pic[j]);
    }

    READ_BITS(bitctx, 3, &rps->num_to_remove);
    for (j = 0; j < rps->num_to_remove; j++) {
        READ_BITS(bitctx, 6, &rps->remove_pic[j]);
        AVS2D_PARSE_TRACE("num_of_removed_pic[%d]=%d", j, rps->remove_pic[j]);
    }

    READ_MARKER_BIT(bitctx);
    AVS2D_PARSE_TRACE("Out ret %d\n", ret);
    return ret;
__BITREAD_ERR:
    AVS2D_PARSE_TRACE("Out Bit read Err\n");
    return ret = bitctx->ret;
__FAILED:
    AVS2D_PARSE_TRACE("Out Failed\n");
    return ret;
}